

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

void uECC_vli_modMult(uECC_word_t *result,uECC_word_t *left,uECC_word_t *right,uECC_word_t *mod,
                     wordcount_t num_words)

{
  uECC_word_t local_78;
  uECC_word_t product [8];
  wordcount_t num_words_local;
  uECC_word_t *mod_local;
  uECC_word_t *right_local;
  uECC_word_t *left_local;
  uECC_word_t *result_local;
  
  uECC_vli_mult(&local_78,left,right,num_words);
  uECC_vli_mmod(result,&local_78,mod,num_words);
  return;
}

Assistant:

uECC_VLI_API void uECC_vli_modMult(uECC_word_t *result,
                                   const uECC_word_t *left,
                                   const uECC_word_t *right,
                                   const uECC_word_t *mod,
                                   wordcount_t num_words) {
    uECC_word_t product[2 * uECC_MAX_WORDS];
    uECC_vli_mult(product, left, right, num_words);
    uECC_vli_mmod(result, product, mod, num_words);
}